

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall
CVmObject::getp_proptype
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  int iVar1;
  vm_val_t val;
  vm_obj_id_t source_obj;
  
  if ((getp_proptype(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_proptype(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    getp_proptype::desc.min_argc_ = 1;
    getp_proptype::desc.opt_argc_ = 0;
    getp_proptype::desc.varargs_ = 0;
    __cxa_guard_release(&getp_proptype(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar1 = get_prop_check_argc(retval,argc,&getp_proptype::desc);
  if (iVar1 == 0) {
    CVmRun::pop_prop(&G_interpreter_X,&val);
    iVar1 = (*this->_vptr_CVmObject[0xd])(this,(ulong)val.val.prop,&val,self,&source_obj,0);
    if (iVar1 != 0) {
      if (val.typ == VM_BIFPTRX) {
        val.typ = VM_BIFPTR;
      }
      else if (val.typ == VM_OBJX) {
        iVar1 = CVmObjAnonFn::is_anonfn_obj(val.val.obj);
        if ((iVar1 == 0) && (iVar1 = CVmDynamicFunc::is_dynfunc_obj(val.val.obj), iVar1 == 0)) {
          iVar1 = CVmObjString::is_string_obj(val.val.obj);
          if (iVar1 == 0) {
            val.typ = VM_OBJ;
          }
          else {
            val.typ = VM_DSTRING;
          }
        }
        else {
          val.typ = VM_CODEOFS;
        }
      }
      vm_val_t::set_datatype(retval,&val);
      return 1;
    }
    retval->typ = VM_NIL;
    return 1;
  }
  return 1;
}

Assistant:

int CVmObject::getp_proptype(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc,
                             vm_prop_id_t, vm_obj_id_t *)
{
    vm_val_t val;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* get the property value */
    if (!get_prop(vmg_ prop, &val, self, &source_obj, 0))
    {
        /* the property isn't defined on the object - the result is nil */
        retval->set_nil();
    }
    else
    {
        /* 
         *   Fix up OBJX (execute-on-eval object reference) and BIFPTRX
         *   (execute-on-eval built-in function pointer) values to reflect
         *   the underlying datatype.  Treat an anonymous function or dynamic
         *   function as a CODEOFS value; treat a string object as a DSTRING
         *   value.  
         */
        if (val.typ == VM_OBJX)
        {
            if (CVmObjAnonFn::is_anonfn_obj(vmg_ val.val.obj)
                || CVmDynamicFunc::is_dynfunc_obj(vmg_ val.val.obj))
                val.typ = VM_CODEOFS;
            else if (CVmObjString::is_string_obj(vmg_ val.val.obj))
                val.typ = VM_DSTRING;
            else
                val.typ = VM_OBJ;
        }
        else if (val.typ == VM_BIFPTRX)
            val.typ = VM_BIFPTR;

        /* set the return value to the property's datatype value */
        retval->set_datatype(vmg_ &val);
    }

    /* handled */
    return TRUE;
}